

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O1

int __thiscall
pg::PTLSolver::attractTangles(PTLSolver *this,int pl,int v,bitset *R,bitset *Z,bitset *G)

{
  int t;
  int *piVar1;
  bool bVar2;
  ostream *poVar3;
  int *piVar4;
  int local_50;
  
  piVar4 = this->tin[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = this->tin[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar4 == piVar1) {
    local_50 = 0;
  }
  else {
    local_50 = 0;
    do {
      t = *piVar4;
      bVar2 = attractTangle(this,t,pl,R,Z,G);
      if ((bVar2) && (local_50 = local_50 + 1, 2 < (this->super_Solver).trace)) {
        poVar3 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"\x1b[1;37mattracted \x1b[1;36m",0x18);
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           (poVar3,(this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_start[t]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[m-tangle ",0xb);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,t);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," to \x1b[1;36m",0xb);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pl);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[m",3);
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      piVar4 = piVar4 + 1;
    } while (piVar4 != piVar1);
  }
  return local_50;
}

Assistant:

inline int
PTLSolver::attractTangles(const int pl, int v, bitset &R, bitset &Z, bitset &G)
{
    int added = 0;
    const auto &in_cur = tin[v];
    for (int from : in_cur) {
        if (attractTangle(from, pl, R, Z, G)) {
            added++;
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[1;36m" << tpr[from] << "\033[m-tangle " << from << " to \033[1;36m" << pl << "\033[m" << std::endl;
            }
#endif
        }
    }
    return added;
}